

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip32.c
# Opt level: O0

int bip32_key_from_base58_alloc(char *base58,ext_key **output)

{
  ext_key *peVar1;
  int ret;
  ext_key **output_local;
  char *base58_local;
  
  if (output == (ext_key **)0x0) {
    base58_local._4_4_ = -2;
  }
  else {
    peVar1 = (ext_key *)wally_calloc(0xc0);
    *output = peVar1;
    if (*output == (ext_key *)0x0) {
      base58_local._4_4_ = -3;
    }
    else {
      base58_local._4_4_ = bip32_key_from_base58(base58,*output);
      if (base58_local._4_4_ != 0) {
        wally_free(*output);
        *output = (ext_key *)0x0;
      }
    }
  }
  return base58_local._4_4_;
}

Assistant:

int bip32_key_from_base58_alloc(const char *base58,
                                struct ext_key **output)
{
    int ret;

    ALLOC_KEY();
    ret = bip32_key_from_base58(base58, *output);
    if (ret != WALLY_OK) {
        wally_free(*output);
        *output = 0;
    }
    return ret;
}